

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

void __thiscall lf::mesh::hybrid2d::Mesh::~Mesh(Mesh *this)

{
  void *pvVar1;
  long lVar2;
  
  (this->super_Mesh)._vptr_Mesh = (_func_int **)&PTR_DimMesh_00496380;
  lVar2 = 0xb0;
  do {
    pvVar1 = *(void **)((long)(this->entity_pointers_)._M_elems + lVar2 + -0x80);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->entity_pointers_)._M_elems + lVar2 + -0x70) -
                             (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x68);
  std::vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
  ::~vector(&this->quads_);
  std::vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>::~vector
            (&this->trias_);
  std::vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>::~vector
            (&this->segments_);
  std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::~vector
            (&this->points_);
  return;
}

Assistant:

[[nodiscard]] unsigned DimMesh() const override { return 2; }